

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketsOps.cpp
# Opt level: O3

int mario::sockets::getSocketError(int sockfd)

{
  int iVar1;
  int *__optval;
  socklen_t optlen;
  int optVal;
  socklen_t local_10;
  int local_c;
  
  local_10 = 4;
  __optval = &local_c;
  iVar1 = getsockopt(sockfd,1,4,__optval,&local_10);
  if (iVar1 < 0) {
    __optval = __errno_location();
  }
  return *__optval;
}

Assistant:

int sockets::getSocketError(int sockfd) {
    int optVal;
    socklen_t optlen = sizeof(optVal);

    if (::getsockopt(sockfd, SOL_SOCKET, SO_ERROR, &optVal, &optlen) < 0) {
        return errno;
    } else {
        return optVal;
    }
}